

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int untrap(boolean force)

{
  xchar *pxVar1;
  undefined1 *puVar2;
  bool bVar3;
  boolean bVar4;
  byte bVar5;
  char cVar6;
  schar sVar7;
  xchar xVar8;
  int iVar9;
  uint uVar10;
  undefined8 in_RAX;
  undefined7 extraout_var;
  trap *ptVar11;
  uint uVar12;
  undefined8 in_RCX;
  obj *poVar13;
  int iVar14;
  char *pcVar15;
  undefined7 in_register_00000039;
  char *pcVar16;
  monst *pmVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  monst *pmVar21;
  int x;
  long lVar22;
  bool bVar23;
  bool bVar24;
  schar dy;
  schar dx;
  schar dz;
  char qbuf [128];
  char the_trap [256];
  char local_1d6;
  char local_1d5;
  undefined4 local_1d4;
  undefined8 local_1d0;
  schar local_1c1;
  long local_1c0;
  char local_1b8 [128];
  char local_138 [264];
  
  local_1d4 = (undefined4)CONCAT71(in_register_00000039,force);
  uVar10 = local_1d0._4_4_;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)CONCAT71((int7)((ulong)in_RAX >> 8),1));
  if ((((u.uprops[0x1c].intrinsic == 0) &&
       (local_1d0 = (ulong)local_1d0._4_4_ << 0x20, u.uprops[0x23].intrinsic != 0)) &&
      (u.uprops[0x24].extrinsic == 0)) &&
     (local_1d0 = CONCAT44(uVar10,(int)CONCAT71((int7)((ulong)in_RCX >> 8),1)),
     u.umonnum != u.umonster)) {
    bVar4 = dmgtype(youmonst.data,0x24);
    local_1d0 = CONCAT44(local_1d0._4_4_,(int)CONCAT71(extraout_var,bVar4 == '\0'));
  }
  iVar9 = getdir((char *)0x0,&local_1d5,&local_1d6,&local_1c1);
  if (iVar9 == 0) {
    return 0;
  }
  lVar22 = (long)u.ux + (long)local_1d5;
  lVar20 = (long)u.uy + (long)local_1d6;
  poVar13 = level->objects[lVar22][lVar20];
  if (poVar13 == (obj *)0x0) {
    pcVar15 = "are containers";
    bVar23 = true;
  }
  else {
    iVar9 = 0;
    bVar23 = false;
    do {
      bVar3 = bVar23;
      if ((poVar13->otyp & 0xfffeU) == 0xda) {
        if (local_1d6 == '\0' && local_1d5 == '\0') {
LAB_0026b3da:
          bVar23 = true;
          bVar24 = iVar9 != 0;
          iVar9 = 1;
          bVar3 = true;
          if (bVar24) {
            iVar9 = 2;
            break;
          }
        }
      }
      else if (poVar13->otyp == 0xdc && (local_1d6 == '\0' && local_1d5 == '\0')) goto LAB_0026b3da;
      bVar23 = bVar3;
      poVar13 = (poVar13->v).v_nexthere;
    } while (poVar13 != (obj *)0x0);
    bVar23 = !bVar23;
    pcVar15 = "are containers";
    if (iVar9 == 1) {
      pcVar15 = "is a container";
    }
  }
  ptVar11 = level->lev_traps;
  while( true ) {
    x = (int)lVar22;
    iVar9 = (int)lVar20;
    if (ptVar11 == (trap *)0x0) break;
    if ((x == ptVar11->tx) && (iVar9 == ptVar11->ty)) goto LAB_0026b4aa;
    ptVar11 = ptVar11->ntrap;
  }
  ptVar11 = (trap *)0x0;
LAB_0026b4aa:
  if ((ptVar11 == (trap *)0x0) || ((ptVar11->field_0x8 & 0x20) == 0)) {
    bVar3 = false;
    lVar19 = lVar22 * 0xa8;
LAB_0026b4be:
    if (local_1d5 == '\0' && local_1d6 == '\0') {
      pmVar21 = *(monst **)((long)level->objects[0] + lVar20 * 8 + lVar19);
      if (pmVar21 != (monst *)0x0) {
        bVar23 = (char)local_1d4 != '\0';
        bVar24 = (char)local_1d0 == '\0';
        do {
          if ((ushort)(*(short *)((long)&pmVar21->m_id + 2) - 0xdaU) < 3) {
            pcVar15 = doname((obj *)pmVar21);
            pcVar16 = simple_typename((int)*(short *)((long)&pmVar21->m_id + 2));
            pcVar16 = an(pcVar16);
            pcVar15 = safe_qbuf("",0x24,pcVar15,pcVar16,"a box");
            sprintf(local_1b8,"There is %s here. Check it for traps?",pcVar15);
            cVar6 = yn_function(local_1b8,"ynq",'q');
            if (cVar6 != 'n') {
              if (cVar6 == 'q') {
                return 0;
              }
              if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
                pcVar15 = mon_nam(u.usteed);
                pcVar16 = "You aren\'t skilled enough to reach from %s.";
                iVar9 = 0;
                goto LAB_0026bae3;
              }
              if ((((*(byte *)((long)pmVar21->mtrack + 7) & 0x80) == 0) ||
                  (((char)local_1d4 == '\0' &&
                   (((char)local_1d0 != '\0' ||
                    (lVar20 = (long)u.ulevel, uVar10 = mt_random(),
                    9 < SUB164(ZEXT416(uVar10) % SEXT816(0x1f - lVar20),0))))))) &&
                 ((bVar24 || bVar23 || (uVar10 = mt_random(), 0x55555555 < uVar10 * -0x55555555))))
              {
                pcVar15 = xname((obj *)pmVar21);
                pcVar15 = the(pcVar15);
                pline("You find no traps on %s.",pcVar15);
                return 1;
              }
              pcVar15 = xname((obj *)pmVar21);
              pcVar15 = the(pcVar15);
              pline("You find a trap on %s!",pcVar15);
              if ((char)local_1d0 == '\0') {
                exercise(2,'\x01');
              }
              cVar6 = yn_function("Disarm it?","ynq",'q');
              bVar3 = true;
              if (cVar6 != 'n') {
                iVar9 = 1;
                if (cVar6 == 'q') {
                  return 1;
                }
                if ((pmVar21->mtrack[3].y & 0x80U) != 0) {
                  exercise(3,'\x01');
                  sVar7 = acurr(3);
                  iVar9 = sVar7 + u.ulevel;
                  bVar23 = urole.malenum == 0x164;
                  if ((char)local_1d4 == '\0') {
                    if ((((char)local_1d0 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                       (u.uprops[0x25].extrinsic == 0)) {
                      xVar8 = level_difficulty(&u.uz);
                      uVar10 = mt_random();
                      if ((int)((ulong)uVar10 % ((long)(xVar8 / '\x02') + 0x4bU)) < iVar9 << bVar23)
                      goto LAB_0026bb3b;
                    }
                    chest_trap((obj *)pmVar21,3,'\x01');
                    return 1;
                  }
LAB_0026bb3b:
                  pline("You disarm it!");
                  pxVar1 = &pmVar21->mtrack[3].y;
                  *pxVar1 = *pxVar1 & 0x7f;
                  return 1;
                }
                pcVar15 = xname((obj *)pmVar21);
                pcVar16 = "That %s was not trapped.";
                goto LAB_0026bae3;
              }
            }
          }
          pmVar21 = ((vptrs *)&pmVar21->data)->v_ocarry;
        } while (pmVar21 != (monst *)0x0);
      }
      pcVar15 = "You find no other traps here.";
      if (!bVar3) {
        pcVar15 = "You know of no traps here.";
      }
    }
    else {
      pmVar21 = *(monst **)((long)level->monsters[0] + lVar20 * 8 + lVar19);
      pmVar17 = (monst *)0x0;
      if ((pmVar21 != (monst *)0x0) && ((pmVar21->field_0x61 & 2) == 0)) {
        pmVar17 = pmVar21;
      }
      if ((((pmVar17 != (monst *)0x0) && (pmVar17->m_ap_type == '\x01')) &&
          ((pmVar17->mappearance == 0x1c || (pmVar17->mappearance == 0x1b)))) &&
         ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
        stumble_onto_mimic(pmVar17,local_1d5,local_1d6);
        return 1;
      }
      if (level->locations[lVar22][lVar20].typ == '\x17') {
        uVar10 = *(uint *)&level->locations[lVar22][lVar20].field_0x6;
        uVar12 = uVar10 >> 4 & 0x1f;
        if (uVar12 == 2) {
          pcVar15 = "This door is safely open.";
        }
        else {
          if (uVar12 != 1) {
            if (uVar12 != 0) {
              if ((((uVar10 >> 8 & 1) == 0) ||
                  (((char)local_1d4 == '\0' &&
                   (((char)local_1d0 != '\0' ||
                    (iVar14 = 0x29 - u.ulevel, uVar10 = mt_random(),
                    9 < SUB164(ZEXT416(uVar10) % SEXT816((long)iVar14),0))))))) &&
                 (((char)local_1d4 != '\0' ||
                  (((char)local_1d0 == '\0' ||
                   (uVar10 = mt_random(), 0x55555555 < uVar10 * -0x55555555)))))) {
                pline("You find no traps on the door.");
                return 1;
              }
              pline("You find a trap on the door!");
              iVar14 = 1;
              exercise(2,'\x01');
              cVar6 = yn_function("Disarm it?","ynq",'q');
              if (cVar6 != 'y') {
                return 1;
              }
              if ((level->locations[lVar22][lVar20].field_0x7 & 1) != 0) {
                iVar14 = u.ulevel * 3;
                if (urole.malenum != 0x164) {
                  iVar14 = u.ulevel;
                }
                local_1c0 = CONCAT44(local_1c0._4_4_,iVar14);
                exercise(3,'\x01');
                if ((char)local_1d4 == '\0') {
                  if ((((char)local_1d0 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                     (u.uprops[0x25].extrinsic == 0)) {
                    iVar14 = (int)local_1c0 + 0xf;
                    xVar8 = level_difficulty(&u.uz);
                    local_1d0 = (long)(xVar8 / '\x02') + 0x4b;
                    uVar10 = mt_random();
                    if ((int)((ulong)uVar10 % local_1d0) < iVar14) goto LAB_0026bc4e;
                  }
                  pline("You set it off!");
                  b_trapped("door",3);
                  puVar2 = &level->locations[lVar22][lVar20].field_0x6;
                  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
                  unblock_point(x,iVar9);
                  newsym(x,iVar9);
                  pcVar15 = in_rooms(level,(xchar)lVar22,(xchar)lVar20,0x12);
                  if (*pcVar15 != '\0') {
                    add_damage((xchar)lVar22,(xchar)lVar20,0);
                    return 1;
                  }
                  return 1;
                }
LAB_0026bc4e:
                pline("You disarm it!");
                puVar2 = &level->locations[lVar22][lVar20].field_0x6;
                *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffeff;
                return 1;
              }
              pcVar15 = "This door was not trapped.";
              goto LAB_0026b98f;
            }
            if (((u.uprops[0x1e].intrinsic == 0) &&
                ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)) {
              pcVar15 = "see";
            }
            else if (ublindf == (obj *)0x0) {
              pcVar15 = "feel";
            }
            else {
              pcVar15 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar15 = "see";
              }
            }
            pcVar16 = "You %s no door there.";
            goto LAB_0026bae0;
          }
          pcVar15 = "This door is broken.";
        }
      }
      else {
        for (ptVar11 = level->lev_traps; ptVar11 != (trap *)0x0; ptVar11 = ptVar11->ntrap) {
          if ((x == ptVar11->tx) && (iVar9 == ptVar11->ty)) goto LAB_0026b80c;
        }
        ptVar11 = (trap *)0x0;
LAB_0026b80c:
        if ((ptVar11 == (trap *)0x0) || ((ptVar11->field_0x8 & 0x20) == 0)) {
          pcVar15 = "You know of no traps there.";
        }
        else {
          pcVar15 = "You cannot disable that trap.";
        }
      }
    }
LAB_0026b98c:
    iVar14 = 0;
LAB_0026b98f:
    pline(pcVar15);
    return iVar14;
  }
  local_1c0 = lVar22 * 0xa8;
  pcVar16 = the(defexplain[(ulong)((byte)ptVar11->field_0x8 & 0x1f) + 0x2f]);
  strcpy(local_138,pcVar16);
  bVar3 = false;
  bVar24 = false;
  if (!bVar23) {
    uVar10 = (byte)ptVar11->field_0x8 & 0x1f;
    if ((byte)((char)uVar10 - 0xbU) < 2) {
      pcVar15 = " that you\'re stuck in";
      if (u.utrap == 0) {
        pcVar15 = " while standing on the edge of it";
      }
      pline("You can\'t do much about %s%s.",local_138,pcVar15);
    }
    else {
      pcVar16 = an(defexplain[(ulong)uVar10 + 0x2f]);
      pcVar18 = "Disarm";
      if ((ptVar11->field_0x8 & 0x1f) == 0x13) {
        pcVar18 = "Remove";
      }
      bVar24 = false;
      sprintf(local_1b8,"There %s and %s here. %s %s?",pcVar15,pcVar16,pcVar18,local_138);
      cVar6 = yn_function(local_1b8,"ynq",'q');
      if (cVar6 == 'q') {
        return 0;
      }
      bVar3 = false;
      if (cVar6 != 'n') goto LAB_0026b8a9;
    }
    bVar3 = true;
    bVar24 = true;
  }
LAB_0026b8a9:
  lVar19 = local_1c0;
  if (bVar24) goto LAB_0026b4be;
  if (u.utrap != 0) {
    pcVar15 = "";
    if (u.uy == iVar9 && u.ux == x) {
      pcVar15 = " in it";
    }
    pline("You cannot deal with %s while trapped%s!",local_138,pcVar15);
    return 1;
  }
  bVar5 = ptVar11->field_0x8 & 0x1f;
  switch(bVar5) {
  case 1:
    iVar9 = 1;
    goto LAB_0026bcbf;
  case 2:
    iVar9 = 7;
    goto LAB_0026bcbf;
  case 3:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
switchD_0026b932_caseD_3:
    pcVar15 = "this";
    if (local_1d6 != '\0' || local_1d5 != '\0') {
      pcVar15 = "that";
    }
    pcVar16 = "You cannot disable %s trap.";
LAB_0026bae0:
    iVar9 = 0;
LAB_0026bae3:
    pline(pcVar16,pcVar15);
    break;
  case 4:
    iVar9 = disarm_squeaky_board(ptVar11,local_1d5,local_1d6);
    break;
  case 5:
  case 0x13:
    iVar9 = disarm_holdingtrap(ptVar11,local_1d5,local_1d6);
    break;
  case 6:
    iVar9 = disarm_landmine(ptVar11,local_1d5,local_1d6);
    break;
  case 0xb:
  case 0xc:
    if (local_1d6 == '\0' && local_1d5 == '\0') {
      pcVar15 = "You are already on the edge of the pit.";
    }
    else {
      pmVar21 = *(monst **)((long)level->monsters[0] + lVar20 * 8 + local_1c0);
      pmVar17 = (monst *)0x0;
      if ((pmVar21 != (monst *)0x0) && ((pmVar21->field_0x61 & 2) == 0)) {
        pmVar17 = pmVar21;
      }
      if (pmVar17 != (monst *)0x0) {
        iVar9 = help_monster_out(pmVar17,ptVar11);
        return iVar9;
      }
      pcVar15 = "Try filling the pit instead.";
    }
    goto LAB_0026b98c;
  default:
    if (bVar5 != 0x18) goto switchD_0026b932_caseD_3;
    iVar9 = 8;
LAB_0026bcbf:
    iVar9 = disarm_shooting_trap(ptVar11,iVar9,local_1d5,local_1d6);
  }
  return iVar9;
}

Assistant:

int untrap(boolean force)
{
	struct obj *otmp;
	boolean confused = (Confusion > 0 || Hallucination > 0);
	int x,y;
	int ch;
	struct trap *ttmp;
	struct monst *mtmp;
	boolean trap_skipped = FALSE;
	boolean box_here = FALSE;
	boolean deal_with_floor_trap = FALSE;
	char the_trap[BUFSZ], qbuf[QBUFSZ];
	int containercnt = 0;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	x = u.ux + dx;
	y = u.uy + dy;

	for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere) {
		if (Is_box(otmp) && !dx && !dy) {
			box_here = TRUE;
			containercnt++;
			if (containercnt > 1) break;
		}
	}

	if ((ttmp = t_at(level, x,y)) && ttmp->tseen) {
		deal_with_floor_trap = TRUE;
		strcpy(the_trap, the(trapexplain[ttmp->ttyp-1]));
		if (box_here) {
			if (ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT) {
			    pline("You can't do much about %s%s.",
					the_trap, u.utrap ?
					" that you're stuck in" :
					" while standing on the edge of it");
			    trap_skipped = TRUE;
			    deal_with_floor_trap = FALSE;
			} else {
			    sprintf(qbuf, "There %s and %s here. %s %s?",
				(containercnt == 1) ? "is a container" : "are containers",
				an(trapexplain[ttmp->ttyp-1]),
				ttmp->ttyp == WEB ? "Remove" : "Disarm", the_trap);
			    switch (ynq(qbuf)) {
				case 'q': return 0;
				case 'n': trap_skipped = TRUE;
					  deal_with_floor_trap = FALSE;
					  break;
			    }
			}
		}
		if (deal_with_floor_trap) {
		    if (u.utrap) {
			pline("You cannot deal with %s while trapped%s!", the_trap,
				(x == u.ux && y == u.uy) ? " in it" : "");
			return 1;
		    }
		    switch(ttmp->ttyp) {
			case BEAR_TRAP:
			case WEB:
				return disarm_holdingtrap(ttmp, dx, dy);
			case LANDMINE:
				return disarm_landmine(ttmp, dx, dy);
			case SQKY_BOARD:
				return disarm_squeaky_board(ttmp, dx, dy);
			case DART_TRAP:
				return disarm_shooting_trap(ttmp, DART, dx, dy);
			case SHURIKEN_TRAP:
				return disarm_shooting_trap(ttmp, SHURIKEN, dx, dy);
			case ARROW_TRAP:
				return disarm_shooting_trap(ttmp, ARROW, dx, dy);
			case PIT:
			case SPIKED_PIT:
				if (!dx && !dy) {
				    pline("You are already on the edge of the pit.");
				    return 0;
				}
				if (!(mtmp = m_at(level, x,y))) {
				    pline("Try filling the pit instead.");
				    return 0;
				}
				return help_monster_out(mtmp, ttmp);
			default:
				pline("You cannot disable %s trap.", (dx || dy) ? "that" : "this");
				return 0;
		    }
		}
	} /* end if */

	if (!dx && !dy) {
	    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    sprintf(qbuf, "There is %s here. Check it for traps?",
			safe_qbuf("", sizeof("There is  here. Check it for traps?"),
				doname(otmp), an(simple_typename(otmp->otyp)), "a box"));
		    switch (ynq(qbuf)) {
			case 'q': return 0;
			case 'n': continue;
		    }
		    if (u.usteed && P_SKILL(P_RIDING) < P_BASIC) {
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
			return 0;
		    }
		    if ((otmp->otrapped && (force || (!confused
				&& rn2(MAXULEV + 1 - u.ulevel) < 10)))
		       || (!force && confused && !rn2(3))) {
			pline("You find a trap on %s!", the(xname(otmp)));
			if (!confused) exercise(A_WIS, TRUE);

			switch (ynq("Disarm it?")) {
			    case 'q': return 1;
			    case 'n': trap_skipped = TRUE;  continue;
			}

			if (otmp->otrapped) {
			    exercise(A_DEX, TRUE);
			    ch = ACURR(A_DEX) + u.ulevel;
			    if (Role_if (PM_ROGUE)) ch *= 2;
			    if (!force && (confused || Fumbling ||
				rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
				chest_trap(otmp, FINGER, TRUE);
			    } else {
				pline("You disarm it!");
				otmp->otrapped = 0;
			    }
			} else pline("That %s was not trapped.", xname(otmp));
			return 1;
		    } else {
			pline("You find no traps on %s.", the(xname(otmp)));
			return 1;
		    }
		}

	    pline(trap_skipped ? "You find no other traps here."
			       : "You know of no traps here.");
	    return 0;
	}

	if ((mtmp = m_at(level, x,y))			&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	if (!IS_DOOR(level->locations[x][y].typ)) {
	    if ((ttmp = t_at(level, x,y)) && ttmp->tseen)
		pline("You cannot disable that trap.");
	    else
		pline("You know of no traps there.");
	    return 0;
	}

	switch (level->locations[x][y].doormask) {
	    case D_NODOOR:
		pline("You %s no door there.", Blind ? "feel" : "see");
		return 0;
	    case D_ISOPEN:
		pline("This door is safely open.");
		return 0;
	    case D_BROKEN:
		pline("This door is broken.");
		return 0;
	}

	if ((level->locations[x][y].doormask & D_TRAPPED
	     && (force ||
		 (!confused && rn2(MAXULEV - u.ulevel + 11) < 10)))
	    || (!force && confused && !rn2(3))) {
		pline("You find a trap on the door!");
		exercise(A_WIS, TRUE);
		if (ynq("Disarm it?") != 'y') return 1;
		if (level->locations[x][y].doormask & D_TRAPPED) {
		    ch = 15 + (Role_if (PM_ROGUE) ? u.ulevel*3 : u.ulevel);
		    exercise(A_DEX, TRUE);
		    if (!force && (confused || Fumbling ||
				     rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
			pline("You set it off!");
			b_trapped("door", FINGER);
			level->locations[x][y].doormask = D_NODOOR;
			unblock_point(x, y);
			newsym(x, y);
			/* (probably ought to charge for this damage...) */
			if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
		    } else {
			pline("You disarm it!");
			level->locations[x][y].doormask &= ~D_TRAPPED;
		    }
		} else pline("This door was not trapped.");
		return 1;
	} else {
		pline("You find no traps on the door.");
		return 1;
	}
}